

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pathmatch.c
# Opt level: O0

wchar_t pm_list(char *start,char *end,char c,wchar_t flags)

{
  char *pcVar1;
  char local_3d;
  wchar_t local_3c;
  wchar_t wStack_38;
  char rangeEnd;
  wchar_t nomatch;
  wchar_t match;
  char nextRangeStart;
  char rangeStart;
  char *p;
  wchar_t flags_local;
  char c_local;
  char *end_local;
  char *start_local;
  
  nomatch._3_1_ = '\0';
  wStack_38 = L'\x01';
  local_3c = L'\0';
  _match = start;
  if (((*start == '!') || (*start == '^')) && (start < end)) {
    wStack_38 = L'\0';
    local_3c = L'\x01';
    _match = start + 1;
  }
  do {
    if (end <= _match) {
      return local_3c;
    }
    nomatch._2_1_ = '\0';
    if (*_match == '-') {
      if ((nomatch._3_1_ == '\0') || (_match == end + -1)) {
        if (*_match == c) {
          return wStack_38;
        }
      }
      else {
        local_3d = _match[1];
        pcVar1 = _match + 1;
        if (local_3d == '\\') {
          local_3d = _match[2];
          pcVar1 = _match + 2;
        }
        _match = pcVar1;
        if ((nomatch._3_1_ <= c) && (c <= local_3d)) {
          return wStack_38;
        }
      }
    }
    else {
      if (*_match == '\\') {
        _match = _match + 1;
      }
      if (*_match == c) {
        return wStack_38;
      }
      nomatch._2_1_ = *_match;
    }
    nomatch._3_1_ = nomatch._2_1_;
    _match = _match + 1;
  } while( true );
}

Assistant:

static int
pm_list(const char *start, const char *end, const char c, int flags)
{
	const char *p = start;
	char rangeStart = '\0', nextRangeStart;
	int match = 1, nomatch = 0;

	/* This will be used soon... */
	(void)flags; /* UNUSED */

	/* If this is a negated class, return success for nomatch. */
	if ((*p == '!' || *p == '^') && p < end) {
		match = 0;
		nomatch = 1;
		++p;
	}

	while (p < end) {
		nextRangeStart = '\0';
		switch (*p) {
		case '-':
			/* Trailing or initial '-' is not special. */
			if ((rangeStart == '\0') || (p == end - 1)) {
				if (*p == c)
					return (match);
			} else {
				char rangeEnd = *++p;
				if (rangeEnd == '\\')
					rangeEnd = *++p;
				if ((rangeStart <= c) && (c <= rangeEnd))
					return (match);
			}
			break;
		case '\\':
			++p;
			/* Fall through */
		default:
			if (*p == c)
				return (match);
			nextRangeStart = *p; /* Possible start of range. */
		}
		rangeStart = nextRangeStart;
		++p;
	}
	return (nomatch);
}